

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O3

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_duplBits_naive_manual_::run
          (Test_bitileave_duplBits_naive_manual_ *this)

{
  unsigned_long uVar1;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  bool bVar2;
  size_t b_out;
  long lVar3;
  long *plVar4;
  long *plVar5;
  sbyte sVar6;
  size_t i;
  long lVar7;
  size_type *psVar8;
  long *plVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar22;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_stack_fffffffffffffeb0 [12];
  uint uVar23;
  ulong local_140;
  _Alloc_hider local_138;
  size_type local_130;
  char local_128 [8];
  undefined8 in_stack_fffffffffffffee0;
  long local_108;
  long lStack_100;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *local_60;
  char *pcStack_58;
  undefined8 local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  char *local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  lVar3 = 0;
  lVar7 = 0;
  local_140 = 0;
  do {
    uVar12 = 1L >> ((byte)lVar7 & 0x3f);
    auVar14._8_4_ = (int)lVar3;
    auVar14._0_8_ = lVar3;
    auVar14._12_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar15 = auVar14 | _DAT_001152e0;
    uVar13 = 0;
    lVar11 = 4;
    do {
      lVar22 = auVar15._8_8_;
      local_140 = local_140 | (uVar12 & 0xffffffff) << auVar15._0_8_;
      uVar13 = uVar13 | (uVar12 & 0xffffffff) << lVar22;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar22 + 2;
      lVar11 = lVar11 + -2;
    } while (lVar11 != 0);
    local_140 = uVar13 | local_140;
    lVar3 = lVar3 + 4;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
  uVar23 = 0xf;
  if (local_140 != 0xf) {
    detail::stringify_impl<unsigned_long>(&local_d8,&local_140);
    std::operator+(&local_b8,
                   "Comparison failed: detail::duplBits_naive(1, 4) == 0xfu (with \"detail::duplBits_naive(1, 4)\"="
                   ,&local_d8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_138._M_p = (pointer)*plVar4;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_138._M_p == psVar8) {
      local_128 = (char  [8])*psVar8;
      in_stack_fffffffffffffee0 = plVar4[3];
      local_138._M_p = local_128;
    }
    else {
      local_128 = (char  [8])*psVar8;
    }
    local_130 = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_f8,(uint *)&stack0xfffffffffffffebc);
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138,
                   &local_f8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar4 = (long *)*plVar5;
    plVar9 = plVar5 + 2;
    if (plVar4 == plVar9) {
      local_108 = *plVar9;
      lStack_100 = plVar5[3];
      plVar4 = &local_108;
    }
    else {
      local_108 = *plVar9;
    }
    uVar1 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_28 = "run";
    local_20 = 0x1f;
    msg._M_str._4_4_ = uVar23;
    msg._0_12_ = in_stack_fffffffffffffeb0;
    loc.function = (char *)plVar4;
    loc.file = (char *)in_stack_fffffffffffffee0;
    loc.line = uVar1;
    assertFail(msg,loc);
  }
  lVar3 = 0;
  lVar7 = 0;
  local_140 = 0;
  do {
    uVar12 = 1L >> ((byte)lVar7 & 0x3f);
    auVar16._8_4_ = (int)lVar3;
    auVar16._0_8_ = lVar3;
    auVar16._12_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar17 = auVar16 | _DAT_001152e0;
    uVar13 = 0;
    lVar11 = 8;
    do {
      lVar22 = auVar17._8_8_;
      local_140 = local_140 | (uVar12 & 0xffffffff) << auVar17._0_8_;
      uVar13 = uVar13 | (uVar12 & 0xffffffff) << lVar22;
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar22 + 2;
      lVar11 = lVar11 + -2;
    } while (lVar11 != 0);
    local_140 = uVar13 | local_140;
    lVar3 = lVar3 + 8;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  uVar23 = 0xff;
  if (local_140 != 0xff) {
    detail::stringify_impl<unsigned_long>(&local_d8,&local_140);
    std::operator+(&local_b8,
                   "Comparison failed: detail::duplBits_naive(1, 8) == 0xffu (with \"detail::duplBits_naive(1, 8)\"="
                   ,&local_d8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_138._M_p = (pointer)*plVar4;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_138._M_p == psVar8) {
      local_128 = (char  [8])*psVar8;
      in_stack_fffffffffffffee0 = plVar4[3];
      local_138._M_p = local_128;
    }
    else {
      local_128 = (char  [8])*psVar8;
    }
    local_130 = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_f8,(uint *)&stack0xfffffffffffffebc);
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138,
                   &local_f8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar4 = (long *)*plVar5;
    plVar9 = plVar5 + 2;
    if (plVar4 == plVar9) {
      local_108 = *plVar9;
      lStack_100 = plVar5[3];
      plVar4 = &local_108;
    }
    else {
      local_108 = *plVar9;
    }
    uVar1 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_40 = "run";
    local_38 = 0x20;
    msg_00._M_str._4_4_ = uVar23;
    msg_00._0_12_ = in_stack_fffffffffffffeb0;
    loc_00.function = (char *)plVar4;
    loc_00.file = (char *)in_stack_fffffffffffffee0;
    loc_00.line = uVar1;
    assertFail(msg_00,loc_00);
  }
  lVar3 = 0;
  lVar7 = 0;
  local_140 = 0;
  do {
    uVar12 = 1L >> ((byte)lVar7 & 0x3f);
    auVar18._8_4_ = (int)lVar3;
    auVar18._0_8_ = lVar3;
    auVar18._12_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar19 = auVar18 | _DAT_001152e0;
    uVar13 = 0;
    lVar11 = 0x10;
    do {
      lVar22 = auVar19._8_8_;
      local_140 = local_140 | (uVar12 & 0xffffffff) << auVar19._0_8_;
      uVar13 = uVar13 | (uVar12 & 0xffffffff) << lVar22;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar22 + 2;
      lVar11 = lVar11 + -2;
    } while (lVar11 != 0);
    local_140 = uVar13 | local_140;
    lVar3 = lVar3 + 0x10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  uVar23 = 0xffff;
  if (local_140 != 0xffff) {
    detail::stringify_impl<unsigned_long>(&local_d8,&local_140);
    std::operator+(&local_b8,
                   "Comparison failed: detail::duplBits_naive(1, 16) == 0xffffu (with \"detail::duplBits_naive(1, 16)\"="
                   ,&local_d8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_138._M_p = (pointer)*plVar4;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_138._M_p == psVar8) {
      local_128 = (char  [8])*psVar8;
      in_stack_fffffffffffffee0 = plVar4[3];
      local_138._M_p = local_128;
    }
    else {
      local_128 = (char  [8])*psVar8;
    }
    local_130 = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    detail::stringify_impl<unsigned_int>(&local_f8,(uint *)&stack0xfffffffffffffebc);
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138,
                   &local_f8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar4 = (long *)*plVar5;
    plVar9 = plVar5 + 2;
    if (plVar4 == plVar9) {
      local_108 = *plVar9;
      lStack_100 = plVar5[3];
      plVar4 = &local_108;
    }
    else {
      local_108 = *plVar9;
    }
    uVar1 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    pcStack_58 = "run";
    local_50 = 0x21;
    msg_01._M_str._4_4_ = uVar23;
    msg_01._0_12_ = in_stack_fffffffffffffeb0;
    loc_01.function = (char *)plVar4;
    loc_01.file = (char *)in_stack_fffffffffffffee0;
    loc_01.line = uVar1;
    assertFail(msg_01,loc_01);
  }
  lVar3 = 0;
  sVar6 = 0;
  local_140 = 0;
  bVar2 = true;
  do {
    bVar10 = bVar2;
    auVar20._8_4_ = (int)lVar3;
    auVar20._0_8_ = lVar3;
    auVar20._12_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar21 = auVar20 | _DAT_001152e0;
    uVar12 = 0;
    lVar7 = 0x20;
    do {
      lVar11 = auVar21._8_8_;
      local_140 = local_140 | (1UL >> sVar6 & 0xffffffff) << auVar21._0_8_;
      uVar12 = uVar12 | (1UL >> sVar6 & 0xffffffff) << lVar11;
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar11 + 2;
      lVar7 = lVar7 + -2;
    } while (lVar7 != 0);
    local_140 = uVar12 | local_140;
    lVar3 = lVar3 + 0x20;
    sVar6 = 1;
    bVar2 = false;
  } while (bVar10);
  uVar23 = 0xffffffff;
  if (local_140 == 0xffffffff) {
    return;
  }
  detail::stringify_impl<unsigned_long>(&local_d8,&local_140);
  std::operator+(&local_b8,
                 "Comparison failed: detail::duplBits_naive(1, 32) == 0xffffffffu (with \"detail::duplBits_naive(1, 32)\"="
                 ,&local_d8);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_138._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_138._M_p == psVar8) {
    local_128 = (char  [8])*psVar8;
    in_stack_fffffffffffffee0 = plVar4[3];
    local_138._M_p = local_128;
  }
  else {
    local_128 = (char  [8])*psVar8;
  }
  local_130 = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  detail::stringify_impl<unsigned_int>(&local_f8,(uint *)&stack0xfffffffffffffebc);
  std::operator+(&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138,
                 &local_f8);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
  plVar4 = (long *)*plVar5;
  plVar9 = plVar5 + 2;
  if (plVar4 == plVar9) {
    local_108 = *plVar9;
    lStack_100 = plVar5[3];
    plVar4 = &local_108;
  }
  else {
    local_108 = *plVar9;
  }
  uVar1 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  pcStack_70 = "run";
  local_68 = 0x22;
  msg_02._M_str._4_4_ = uVar23;
  msg_02._0_12_ = in_stack_fffffffffffffeb0;
  loc_02.function = (char *)plVar4;
  loc_02.file = (char *)in_stack_fffffffffffffee0;
  loc_02.line = uVar1;
  assertFail(msg_02,loc_02);
}

Assistant:

BITMANIP_TEST(bitileave, duplBits_naive_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xf, 0), 0u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xf, 2), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0x55, 2), 0x3333u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xff, 2), 0xffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 1), 1u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 2), 3u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 4), 0xfu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 8), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 16), 0xffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 32), 0xffffffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 64), 0xffffffffffffffffu);
}